

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.h
# Opt level: O0

void prng_srand(uint64_t seed,prng_rand_t *state)

{
  prng_rand_t *in_RSI;
  uint64_t in_RDI;
  uint_fast16_t i;
  ulong local_18;
  
  in_RSI->c = 0x37;
  in_RSI->i = 0;
  in_RSI->s[0] = in_RDI;
  for (local_18 = 1; local_18 < 0x40; local_18 = local_18 + 1) {
    in_RSI->s[local_18] = local_18 * 0x7fffffff + in_RDI;
  }
  for (local_18 = 0; local_18 < 10000; local_18 = local_18 + 1) {
    prng_rand(in_RSI);
  }
  return;
}

Assistant:

static inline void prng_srand(uint64_t seed, struct prng_rand_t *state) {
  uint_fast16_t i;
  // Naive seed
  state->c = RAND_EXHAUST_LIMIT;
  state->i = 0;

  state->s[0] = seed;
  for(i=1; i<RAND_SSIZE; i++) {
    // Arbitrary magic, mostly to eliminate the effect of low-value seeds.
    // Probably could be better, but the run-up obviates any real need to.
    state->s[i] = i*(UINT64_C(2147483647)) + seed;
  }

  // Run forward 10,000 numbers
  for(i=0; i<10000; i++) {
    prng_rand(state);
  }
}